

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O2

bool r_exec::equ(Context *context,uint16_t *index)

{
  undefined1 uVar1;
  uint16_t uVar2;
  int iVar3;
  undefined4 extraout_var;
  long *plVar5;
  undefined4 extraout_var_00;
  long *plVar6;
  Atom local_34 [4];
  long *plVar4;
  
  iVar3 = (*context->implementation->_vptr__Context[7])(context->implementation,1);
  plVar4 = (long *)CONCAT44(extraout_var,iVar3);
  plVar5 = (long *)(**(code **)(*plVar4 + 0x40))(plVar4);
  (**(code **)(*plVar4 + 8))(plVar4);
  iVar3 = (*context->implementation->_vptr__Context[7])(context->implementation,2);
  plVar4 = (long *)CONCAT44(extraout_var_00,iVar3);
  plVar6 = (long *)(**(code **)(*plVar4 + 0x40))(plVar4);
  (**(code **)(*plVar4 + 8))(plVar4);
  uVar1 = (**(code **)(*plVar5 + 0x18))(plVar5,plVar6);
  r_code::Atom::Boolean(SUB81(local_34,0));
  uVar2 = Context::setAtomicResult(context,local_34);
  *index = uVar2;
  r_code::Atom::~Atom(local_34);
  if (plVar6 != (long *)0x0) {
    (**(code **)(*plVar6 + 8))(plVar6);
  }
  (**(code **)(*plVar5 + 8))(plVar5);
  return (bool)uVar1;
}

Assistant:

bool equ(const Context &context, uint16_t &index)
{
    Context lhs = *context.getChild(1);
    Context rhs = *context.getChild(2);
    bool r = (lhs == rhs);
    index = context.setAtomicResult(Atom::Boolean(r));
    return r;
}